

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  fpclass_type fVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int32_t iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  uint *puVar18;
  uint uVar19;
  uint uVar20;
  int *piVar21;
  uint *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  int *piVar28;
  byte bVar29;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_3bc;
  undefined1 local_3b8 [32];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [13];
  undefined3 uStack_34b;
  int iStack_348;
  bool bStack_344;
  undefined8 local_340;
  int *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  int *local_320;
  int *local_318;
  pointer local_310;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_308;
  int *local_300;
  int *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  int *local_2e8;
  ulong local_2e0;
  int *local_2d8;
  long local_2d0;
  int *local_2c8;
  cpp_dec_float<200U,_int,_void> *local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  fpclass_type local_240;
  int32_t iStack_23c;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar29 = 0;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  local_2b8._16_16_ = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  iVar8 = 0;
  uStack_24b = 0;
  local_1c0._0_4_ = cpp_dec_float_finite;
  local_1c0._4_4_ = 0x1c;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1cb = 0;
  iStack_1c8 = 0;
  bStack_1c4 = false;
  local_2f8 = (this->row).orig;
  piVar28 = (this->col).orig;
  local_2d8 = (this->col).perm;
  if (0 < rhsn) {
    uVar12 = 0;
    do {
      iVar27 = local_2d8[rhsidx[uVar12]];
      if (uVar12 == 0) {
        uVar20 = 0;
      }
      else {
        uVar13 = uVar12 & 0xffffffff;
        do {
          uVar26 = (uint)uVar13 - 1;
          uVar19 = uVar26 >> 1;
          uVar20 = (uint)uVar13;
          if (rhsidx[uVar19] <= iVar27) break;
          rhsidx[uVar13] = rhsidx[uVar19];
          uVar13 = (ulong)uVar19;
          uVar20 = uVar19;
        } while (1 < uVar26);
      }
      uVar12 = uVar12 + 1;
      rhsidx[(int)uVar20] = iVar27;
    } while (uVar12 != (uint)rhsn);
  }
  if (0 < rhsn) {
    local_310 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_318 = (this->u).row.idx;
    local_300 = (this->u).row.len;
    local_320 = (this->u).row.start;
    uVar12 = 0;
    local_338 = piVar28;
    local_330 = eps;
    local_328 = rhs;
    local_308 = this;
    local_2f0 = vec;
    local_2e8 = vecidx;
    local_2c8 = rhsidx;
    do {
      iVar27 = *rhsidx;
      local_3bc = rhsn - 1;
      iVar9 = rhsidx[(long)rhsn + -1];
      iVar8 = 1;
      iVar11 = 0;
      if (3 < rhsn) {
        iVar11 = 0;
        do {
          iVar1 = rhsidx[iVar8];
          iVar24 = rhsidx[(long)iVar8 + 1];
          piVar21 = rhsidx + iVar11;
          if (iVar1 < iVar24) {
            iVar11 = iVar8;
            iVar24 = iVar1;
            if (iVar9 <= iVar1) goto LAB_005489b6;
          }
          else {
            if (iVar9 <= iVar24) goto LAB_005489b6;
            iVar11 = iVar8 + 1;
          }
          *piVar21 = iVar24;
          iVar8 = iVar11 * 2 + 1;
        } while (iVar8 < (int)(rhsn - 2U));
      }
      if ((iVar8 < (int)local_3bc) && (rhsidx[iVar8] < iVar9)) {
        rhsidx[iVar11] = rhsidx[iVar8];
        iVar11 = iVar8;
      }
      piVar21 = rhsidx + iVar11;
LAB_005489b6:
      *piVar21 = iVar9;
      iVar8 = piVar28[iVar27];
      pcVar15 = &local_328[iVar8].m_backend;
      puVar18 = (uint *)local_2b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar18 = (pcVar15->data)._M_elems[0];
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar29 * -8 + 4);
        puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
      }
      iStack_248 = local_328[iVar8].m_backend.exp;
      bStack_244 = local_328[iVar8].m_backend.neg;
      local_240 = local_328[iVar8].m_backend.fpclass;
      iStack_23c = local_328[iVar8].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&local_328[iVar8].m_backend,0);
      puVar18 = (uint *)local_2b8;
      puVar22 = (uint *)local_3b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar22 = *puVar18;
        puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
        puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
      }
      pnVar14 = local_330;
      pcVar15 = &local_b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar29 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_b0.exp = (local_330->m_backend).exp;
      local_b0.neg = (local_330->m_backend).neg;
      local_b0.fpclass = (local_330->m_backend).fpclass;
      local_b0.prec_elem = (local_330->m_backend).prec_elem;
      iStack_348 = iStack_248;
      bStack_344 = bStack_244;
      local_340._0_4_ = local_240;
      local_340._4_4_ = iStack_23c;
      if ((bStack_244 == true) &&
         (local_3b8._0_4_ != 0 || (fpclass_type)_local_240 != cpp_dec_float_finite)) {
        bStack_344 = false;
      }
      if ((local_b0.fpclass != cpp_dec_float_NaN && (fpclass_type)_local_240 != cpp_dec_float_NaN)
         && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_3b8,&local_b0), 0 < iVar8))
      {
        iVar8 = local_2f8[iVar27];
        uVar13 = (ulong)((int)uVar12 + 1);
        local_2e8[(int)uVar12] = iVar8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                   &(this->diag).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        pnVar14 = local_2f0 + iVar8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar29 * -8 + 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_2f0[iVar8].m_backend.exp = iStack_248;
        local_2f0[iVar8].m_backend.neg = bStack_244;
        local_2f0[iVar8].m_backend.fpclass = local_240;
        local_2f0[iVar8].m_backend.prec_elem = iStack_23c;
        iVar27 = local_300[iVar8];
        uVar12 = uVar13;
        piVar28 = local_338;
        if (iVar27 != 0) {
          local_2e0 = uVar13;
          piVar21 = local_318 + local_320[iVar8];
          pcVar15 = &local_310[local_320[iVar8]].m_backend;
          do {
            lVar25 = (long)*piVar21;
            pnVar14 = local_328 + lVar25;
            pnVar17 = pnVar14;
            puVar18 = (uint *)local_238;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar18 = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar29 * -2 + 1) * 4);
              puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
            }
            iStack_1c8 = local_328[lVar25].m_backend.exp;
            bStack_1c4 = local_328[lVar25].m_backend.neg;
            fVar2 = local_328[lVar25].m_backend.fpclass;
            iVar4 = local_328[lVar25].m_backend.prec_elem;
            local_1c0._0_4_ = fVar2;
            local_1c0._4_4_ = iVar4;
            if (fVar2 == cpp_dec_float_NaN) {
LAB_00548c66:
              local_340._0_4_ = cpp_dec_float_finite;
              local_340._4_4_ = 0x1c;
              local_3b8._0_16_ = (undefined1  [16])0x0;
              local_3b8._16_16_ = (undefined1  [16])0x0;
              local_398 = (undefined1  [16])0x0;
              local_388 = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = SUB1613((undefined1  [16])0x0,0);
              uStack_34b = 0;
              iStack_348 = 0;
              bStack_344 = false;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
              if ((cpp_dec_float<200U,_int,_void> *)local_3b8 != pcVar15) {
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_3b8;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pcVar23->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                  pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar16 + (ulong)bVar29 * -8 + 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar29 * -8 + 4);
                }
                iStack_348 = iStack_248;
                bStack_344 = bStack_244;
                local_340._0_4_ = local_240;
                local_340._4_4_ = iStack_23c;
                pcVar16 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_3b8,pcVar16);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_238,
                         (cpp_dec_float<200U,_int,_void> *)local_3b8);
              if ((fpclass_type)local_1c0 == cpp_dec_float_NaN) {
LAB_00548d44:
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_238;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_3b8;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pcVar23->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                  pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar16 + (ulong)bVar29 * -8 + 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar29 * -8 + 4);
                }
                iStack_348 = iStack_1c8;
                bStack_344 = bStack_1c4;
                local_340._0_4_ = (fpclass_type)local_1c0;
                local_340._4_4_ = local_1c0._4_4_;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_3b8,0,(type *)0x0);
                iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_238,
                                   (cpp_dec_float<200U,_int,_void> *)local_3b8);
                if (iVar8 != 0) goto LAB_00548d44;
                local_340._0_4_ = cpp_dec_float_finite;
                local_340._4_4_ = 0x1c;
                local_3b8._0_16_ = (undefined1  [16])0x0;
                local_3b8._16_16_ = (undefined1  [16])0x0;
                local_398 = (undefined1  [16])0x0;
                local_388 = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = SUB1613((undefined1  [16])0x0,0);
                uStack_34b = 0;
                iStack_348 = 0;
                bStack_344 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_3b8,1e-100);
              }
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_3b8;
              pnVar17 = pnVar14;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              (pnVar14->m_backend).exp = iStack_348;
              (pnVar14->m_backend).neg = bStack_344;
              (pnVar14->m_backend).fpclass = (fpclass_type)local_340;
              (pnVar14->m_backend).prec_elem = local_340._4_4_;
              rhsidx = local_2c8;
            }
            else {
              local_2c0 = pcVar15;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_3b8,0,(type *)0x0);
              pcVar15 = local_2c0;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_238,
                                 (cpp_dec_float<200U,_int,_void> *)local_3b8);
              iVar8 = iStack_248;
              if (iVar9 != 0) goto LAB_00548c66;
              puVar18 = (uint *)local_2b8;
              pcVar16 = &local_1b0;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar16->data)._M_elems[0] = *puVar18;
                puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_1b0.exp = iStack_248;
              local_1b0.neg = bStack_244;
              fVar6 = local_240;
              local_1b0.fpclass = local_240;
              iVar7 = iStack_23c;
              local_1b0.prec_elem = iStack_23c;
              if (local_1b0.data._M_elems[0] != 0 || local_240 != cpp_dec_float_finite) {
                local_1b0.neg = (bool)(bStack_244 ^ 1);
              }
              local_2d0 = lVar25;
              local_340._0_4_ = cpp_dec_float_finite;
              local_340._4_4_ = 0x1c;
              local_3b8._0_16_ = (undefined1  [16])0x0;
              local_3b8._16_16_ = (undefined1  [16])0x0;
              local_398 = (undefined1  [16])0x0;
              local_388 = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = SUB1613((undefined1  [16])0x0,0);
              uStack_34b = 0;
              iStack_348 = 0;
              bStack_344 = false;
              pcVar16 = &local_1b0;
              if ((cpp_dec_float<200U,_int,_void> *)local_3b8 != pcVar15) {
                puVar18 = (uint *)local_2b8;
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_3b8;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pcVar16->data)._M_elems[0] = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
                  pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar16 + (ulong)bVar29 * -8 + 4);
                }
                iStack_348 = iVar8;
                bStack_344 = local_1b0.neg;
                local_340._0_4_ = fVar6;
                local_340._4_4_ = iVar7;
                pcVar16 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_3b8,pcVar16);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_3b8;
              puVar18 = (uint *)local_238;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                *puVar18 = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar29 * -8 + 4)
                ;
                puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
              }
              iStack_1c8 = iStack_348;
              bStack_1c4 = bStack_344;
              local_1c0._0_4_ = (fpclass_type)local_340;
              local_1c0._4_4_ = local_340._4_4_;
              puVar18 = (uint *)local_238;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_3b8;
              for (lVar10 = 0x1c; lVar25 = local_2d0, lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar16->data)._M_elems[0] = *puVar18;
                puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar29 * -8 + 4)
                ;
              }
              pnVar17 = local_330;
              pcVar16 = &local_130;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar16->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar16 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_130.exp = (local_330->m_backend).exp;
              local_130.neg = (local_330->m_backend).neg;
              fVar3 = (local_330->m_backend).fpclass;
              iVar5 = (local_330->m_backend).prec_elem;
              local_130.fpclass = fVar3;
              local_130.prec_elem = iVar5;
              if ((bStack_344 == true) &&
                 (local_3b8._0_4_ != 0 || (fpclass_type)local_340 != cpp_dec_float_finite)) {
                bStack_344 = false;
              }
              if ((fVar3 != cpp_dec_float_NaN && (fpclass_type)local_340 != cpp_dec_float_NaN) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_3b8,&local_130),
                 0 < iVar8)) {
                puVar18 = (uint *)local_238;
                pnVar17 = pnVar14;
                for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (pnVar17->m_backend).data._M_elems[0] = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar29 * -2 + 1;
                  pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar17 + ((ulong)bVar29 * -2 + 1) * 4);
                }
                (pnVar14->m_backend).exp = iStack_1c8;
                (pnVar14->m_backend).neg = bStack_1c4;
                (pnVar14->m_backend).fpclass = (fpclass_type)local_1c0;
                (pnVar14->m_backend).prec_elem = local_1c0._4_4_;
                iVar8 = local_2d8[lVar25];
                uVar20 = local_3bc;
                if (0 < (int)local_3bc) {
                  do {
                    uVar19 = uVar20 - 1;
                    uVar26 = uVar19 >> 1;
                    if (rhsidx[uVar26] <= iVar8) break;
                    rhsidx[uVar20] = rhsidx[uVar26];
                    uVar20 = uVar26;
                  } while (1 < uVar19);
                }
                local_3bc = local_3bc + 1;
                rhsidx[(int)uVar20] = iVar8;
              }
            }
            piVar21 = piVar21 + 1;
            pcVar15 = pcVar15 + 1;
            iVar27 = iVar27 + -1;
            uVar12 = local_2e0;
            this = local_308;
            piVar28 = local_338;
          } while (iVar27 != 0);
        }
      }
      iVar8 = (int)uVar12;
      rhsn = local_3bc;
    } while (0 < (int)local_3bc);
  }
  return iVar8;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}